

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

char MeCab::getEscapedChar(char p)

{
  char p_local;
  char local_1;
  
  switch(p) {
  case '0':
    local_1 = '\0';
    break;
  default:
    local_1 = '\0';
    break;
  case '\\':
    local_1 = '\\';
    break;
  case 'a':
    local_1 = '\a';
    break;
  case 'b':
    local_1 = '\b';
    break;
  case 'f':
    local_1 = '\f';
    break;
  case 'n':
    local_1 = '\n';
    break;
  case 'r':
    local_1 = '\r';
    break;
  case 's':
    local_1 = ' ';
    break;
  case 't':
    local_1 = '\t';
    break;
  case 'v':
    local_1 = '\v';
  }
  return local_1;
}

Assistant:

inline char getEscapedChar(const char p) {
  switch (p) {
    case '0':  return '\0';
    case 'a':  return '\a';
    case 'b':  return '\b';
    case 't':  return '\t';
    case 'n':  return '\n';
    case 'v':  return '\v';
    case 'f':  return '\f';
    case 'r':  return '\r';
    case 's':  return ' ';
    case '\\': return '\\';
    default: break;
  }

  return '\0';  // never be here
}